

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blocking_queue_test.cpp
# Opt level: O1

void __thiscall
bidfx_public_api::tools::BlockingQueueTest_test_can_push_three_times_and_pop_out_as_queue_Test::
~BlockingQueueTest_test_can_push_three_times_and_pop_out_as_queue_Test
          (BlockingQueueTest_test_can_push_three_times_and_pop_out_as_queue_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(BlockingQueueTest, test_can_push_three_times_and_pop_out_as_queue)
{
    BlockingQueue<int> queue = BlockingQueue<int>();
    queue.Push(1);
    queue.Push(2);
    queue.Push(3);
    queue.Push(4);
    queue.Push(5);

    EXPECT_EQ(1, *queue.Pop());
    EXPECT_EQ(2, *queue.Pop());
    EXPECT_EQ(3, *queue.Pop());
    EXPECT_EQ(4, *queue.Pop());
    EXPECT_EQ(5, *queue.Pop());
}